

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testrand_impl.h
# Opt level: O2

uint32_t secp256k1_testrand_int(uint32_t range)

{
  uint uVar1;
  uint64_t uVar2;
  uint uVar3;
  
  uVar3 = 0;
  for (uVar1 = range - 1; uVar1 != 0; uVar1 = uVar1 >> 1) {
    uVar3 = uVar3 * 2 + 1;
  }
  do {
    uVar2 = secp256k1_testrand64();
    uVar1 = (uint)uVar2 & uVar3;
  } while (range - 1 < uVar1);
  return uVar1;
}

Assistant:

static uint32_t secp256k1_testrand_int(uint32_t range) {
    uint32_t mask = 0;
    uint32_t range_copy;
    /* Reduce range by 1, changing its meaning to "maximum value". */
    VERIFY_CHECK(range != 0);
    range -= 1;
    /* Count the number of bits in range. */
    range_copy = range;
    while (range_copy) {
        mask = (mask << 1) | 1U;
        range_copy >>= 1;
    }
    /* Generation loop. */
    while (1) {
        uint32_t val = secp256k1_testrand64() & mask;
        if (val <= range) return val;
    }
}